

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprToRegister(Expr *pExpr,int iReg)

{
  Expr *pEVar1;
  int in_ESI;
  Expr *in_RDI;
  Expr *p;
  
  pEVar1 = sqlite3ExprSkipCollateAndLikely(in_RDI);
  if ((pEVar1 != (Expr *)0x0) && (pEVar1->op != 0xb0)) {
    pEVar1->op2 = pEVar1->op;
    pEVar1->op = 0xb0;
    pEVar1->iTable = in_ESI;
    pEVar1->flags = pEVar1->flags & 0xffffdfff;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprToRegister(Expr *pExpr, int iReg){
  Expr *p = sqlite3ExprSkipCollateAndLikely(pExpr);
  if( NEVER(p==0) ) return;
  if( p->op==TK_REGISTER ){
    assert( p->iTable==iReg );
  }else{
    p->op2 = p->op;
    p->op = TK_REGISTER;
    p->iTable = iReg;
    ExprClearProperty(p, EP_Skip);
  }
}